

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20240722::debugging_internal::ParseSourceName(State *state)

{
  char *str;
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  ulong length_00;
  int length;
  ParseState copy;
  uint local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    local_28._0_4_ = (state->parse_state).mangled_idx;
    local_28._4_4_ = (state->parse_state).out_cur_idx;
    uStack_20 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    local_2c = 0xffffffff;
    bVar5 = ParseNumber(state,(int *)&local_2c);
    uVar4 = local_2c;
    if (bVar5) {
      length_00 = (ulong)(int)local_2c;
      iVar1 = state->recursion_depth;
      iVar2 = state->steps;
      state->recursion_depth = iVar1 + 1;
      state->steps = iVar2 + 1;
      if (iVar2 < 0x20000 && iVar1 < 0x100) {
        pcVar3 = state->mangled_begin;
        lVar7 = (long)(state->parse_state).mangled_idx;
        str = pcVar3 + lVar7;
        bVar5 = local_2c == 0;
        if (!bVar5) {
          if (*str == '\0') goto LAB_00103372;
          uVar9 = 0;
          do {
            uVar10 = length_00;
            if (length_00 - 1 == uVar9) break;
            uVar10 = uVar9 + 1;
            lVar6 = uVar9 + lVar7 + 1;
            uVar9 = uVar10;
          } while (pcVar3[lVar6] != '\0');
          bVar5 = length_00 <= uVar10;
        }
        if (bVar5) {
          if (local_2c < 0xc) {
LAB_0010339d:
            MaybeAppendWithLength(state,str,length_00);
          }
          else {
            cVar8 = *str;
            if (cVar8 == '\0') {
              lVar6 = 0;
            }
            else {
              lVar6 = 0;
              do {
                if (cVar8 != "_GLOBAL__N_"[lVar6]) break;
                cVar8 = pcVar3[lVar6 + lVar7 + 1];
                lVar6 = lVar6 + 1;
              } while (cVar8 != '\0');
            }
            if ("_GLOBAL__N_"[lVar6] != '\0') goto LAB_0010339d;
            MaybeAppend(state,"(anonymous namespace)");
          }
          (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + uVar4;
          state->recursion_depth = state->recursion_depth + -1;
          bVar5 = true;
          goto LAB_00103383;
        }
      }
LAB_00103372:
      state->recursion_depth = state->recursion_depth + -1;
    }
    (state->parse_state).mangled_idx = (undefined4)local_28;
    (state->parse_state).out_cur_idx = local_28._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_20;
  }
  bVar5 = false;
LAB_00103383:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar5;
}

Assistant:

static bool ParseSourceName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  int length = -1;
  if (ParseNumber(state, &length) &&
      ParseIdentifier(state, static_cast<size_t>(length))) {
    return true;
  }
  state->parse_state = copy;
  return false;
}